

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::CumulativeReporterBase::testRunEnded(CumulativeReporterBase *this,TestRunStats *testRunStats)

{
  pointer pcVar1;
  pointer pPVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  size_t sVar7;
  size_t sVar8;
  pointer pPVar9;
  pointer pPVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  Node<Catch::TestRunStats,_Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>
  *pNVar14;
  Ptr<Catch::CumulativeReporterBase::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
  node;
  value_type local_20;
  
  pNVar14 = (Node<Catch::TestRunStats,_Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>
             *)operator_new(0x88);
  (pNVar14->super_SharedImpl<Catch::IShared>).m_rc = 0;
  (pNVar14->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__Node_0016fa18;
  (pNVar14->value)._vptr_TestRunStats = (_func_int **)&PTR__TestRunStats_0016db30;
  (pNVar14->value).runInfo.name._M_dataplus._M_p = (pointer)&(pNVar14->value).runInfo.name.field_2;
  pcVar1 = (testRunStats->runInfo).name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(pNVar14->value).runInfo,pcVar1,
             pcVar1 + (testRunStats->runInfo).name._M_string_length);
  (pNVar14->value).aborting = testRunStats->aborting;
  sVar7 = (testRunStats->totals).assertions.passed;
  sVar8 = (testRunStats->totals).assertions.failed;
  sVar11 = (testRunStats->totals).assertions.failedButOk;
  uVar3 = *(undefined4 *)((long)&(testRunStats->totals).assertions.failedButOk + 4);
  sVar12 = (testRunStats->totals).testCases.passed;
  uVar4 = *(undefined4 *)((long)&(testRunStats->totals).testCases.passed + 4);
  uVar5 = *(undefined4 *)((long)&(testRunStats->totals).testCases.failed + 4);
  sVar13 = (testRunStats->totals).testCases.failedButOk;
  uVar6 = *(undefined4 *)((long)&(testRunStats->totals).testCases.failedButOk + 4);
  *(int *)&(pNVar14->value).totals.testCases.failed = (int)(testRunStats->totals).testCases.failed;
  *(undefined4 *)((long)&(pNVar14->value).totals.testCases.failed + 4) = uVar5;
  *(int *)&(pNVar14->value).totals.testCases.failedButOk = (int)sVar13;
  *(undefined4 *)((long)&(pNVar14->value).totals.testCases.failedButOk + 4) = uVar6;
  *(int *)&(pNVar14->value).totals.assertions.failedButOk = (int)sVar11;
  *(undefined4 *)((long)&(pNVar14->value).totals.assertions.failedButOk + 4) = uVar3;
  *(int *)&(pNVar14->value).totals.testCases.passed = (int)sVar12;
  *(undefined4 *)((long)&(pNVar14->value).totals.testCases.passed + 4) = uVar4;
  (pNVar14->value).totals.assertions.passed = sVar7;
  (pNVar14->value).totals.assertions.failed = sVar8;
  (pNVar14->children).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pNVar14->children).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pNVar14->children).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_20.m_p = pNVar14;
  (*(pNVar14->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable[2]
  )(pNVar14);
  pPVar9 = ((local_20.m_p)->children).
           super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar10 = ((local_20.m_p)->children).
            super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pPVar2 = ((local_20.m_p)->children).
           super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ((local_20.m_p)->children).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->m_testGroups).
       super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  ((local_20.m_p)->children).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->m_testGroups).
       super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  ((local_20.m_p)->children).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->m_testGroups).
       super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_testGroups).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pPVar9;
  (this->m_testGroups).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pPVar10;
  (this->m_testGroups).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pPVar2;
  std::
  vector<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>_>
  ::push_back(&this->m_testRuns,&local_20);
  (*(this->super_SharedImpl<Catch::IStreamingReporter>).super_IStreamingReporter.super_IShared.
    super_NonCopyable._vptr_NonCopyable[0x12])(this);
  if (local_20.m_p !=
      (Node<Catch::TestRunStats,_Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>
       *)0x0) {
    (*((local_20.m_p)->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
      _vptr_NonCopyable[3])();
  }
  return;
}

Assistant:

virtual void testRunEnded( TestRunStats const& testRunStats ) CATCH_OVERRIDE {
            Ptr<TestRunNode> node = new TestRunNode( testRunStats );
            node->children.swap( m_testGroups );
            m_testRuns.push_back( node );
            testRunEndedCumulative();
        }